

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

void opengv::relative_pose::modules::ge::getEV
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,Vector4d *roots)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  Matrix4d G;
  double local_108;
  Matrix4d local_100;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  composeG(&local_100,xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  auVar2 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4];
  auVar3 = vmulsd_avx512f(auVar32,ZEXT816(0xc000000000000000));
  dVar15 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
  dVar1 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[9] *
          local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[9];
  auVar4 = vmulsd_avx512f(auVar26,auVar39);
  auVar5 = vxorpd_avx512vl(auVar20,auVar2);
  auVar6 = vmulsd_avx512f(auVar46,auVar46);
  auVar2 = vxorpd_avx512vl(auVar16,auVar2);
  dVar13 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[8] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[8];
  dVar31 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[4] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[4];
  auVar7 = vmulsd_avx512f(auVar26,auVar16);
  auVar8 = vmulsd_avx512f(auVar39,auVar2);
  auVar2 = vmulsd_avx512f(auVar3,auVar35);
  auVar3 = vmulsd_avx512f(auVar39,auVar6);
  auVar9 = vmulsd_avx512f(auVar2,auVar36);
  auVar3 = vmulsd_avx512f(auVar26,auVar3);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (auVar5._0_8_ -
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10]) - local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[5];
  auVar5 = vsubsd_avx512f(auVar27,auVar16);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xe];
  auVar2 = vfmsub213sd_fma(auVar20,auVar26,auVar12);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar15;
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar40,auVar26);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar3 = vfmsub231sd_avx512f(auVar3,auVar10,auVar6);
  vmovsd_avx512f(auVar5);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar10,auVar20);
  auVar9 = vfmadd231sd_avx512f(auVar9,auVar39,auVar12);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (auVar2._0_8_ - dVar15) - dVar1;
  auVar2 = vfmadd231sd_fma(auVar28,auVar39,auVar20);
  auVar4 = vfnmadd213sd_avx512f(auVar4,auVar20,auVar9);
  auVar9 = vmulsd_avx512f(auVar43,ZEXT816(0xc000000000000000));
  auVar2 = vfmadd231sd_fma(auVar2,auVar39,auVar26);
  auVar10 = vmulsd_avx512f(auVar45,ZEXT816(0xc000000000000000));
  auVar9 = vmulsd_avx512f(auVar9,auVar46);
  auVar11 = vmulsd_avx512f(auVar10,auVar46);
  auVar10 = vmulsd_avx512f(auVar10,auVar43);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar6,auVar26);
  auVar2 = vsubsd_avx512f(auVar2,auVar6);
  auVar12 = vmulsd_avx512f(auVar9,auVar32);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar6,auVar39);
  auVar3 = vfmadd213sd_avx512f(auVar12,auVar35,auVar3);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar9,auVar36);
  auVar6 = vaddsd_avx512f(auVar43,auVar43);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (auVar2._0_8_ - dVar13) - dVar31;
  auVar2 = vfmadd231sd_fma(auVar29,auVar16,auVar20);
  auVar6 = vmulsd_avx512f(auVar6,auVar46);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar13;
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar48,auVar20);
  auVar2 = vfmadd231sd_fma(auVar2,auVar16,auVar26);
  auVar6 = vmulsd_avx512f(auVar6,auVar39);
  auVar9 = vfmadd231sd_avx512f(auVar4,auVar48,auVar39);
  auVar3 = vfmadd213sd_avx512f(auVar6,auVar36,auVar3);
  auVar4 = vfmadd231sd_fma(auVar2,auVar16,auVar39);
  auVar2 = vfmadd231sd_avx512f(auVar9,auVar11,auVar35);
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar48,auVar40);
  auVar2 = vfmadd231sd_avx512f(auVar2,auVar10,auVar32);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5] * dVar13;
  auVar3 = vfnmadd213sd_avx512f(auVar49,auVar20,auVar3);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar31;
  auVar6 = vfmadd231sd_avx512f(auVar2,auVar37,auVar20);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4]) * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc] *
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  auVar2 = vfmadd213sd_fma(auVar47,auVar26,auVar3);
  auVar3 = vmulsd_avx512f(auVar11,auVar32);
  auVar6 = vfmadd231sd_avx512f(auVar6,auVar37,auVar26);
  auVar2 = vfmadd213sd_fma(auVar3,auVar36,auVar2);
  auVar3 = vmulsd_avx512f(auVar10,auVar35);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe];
  auVar6 = vfmadd231sd_avx512f(auVar6,auVar16,auVar9);
  auVar2 = vfmadd213sd_fma(auVar3,auVar36,auVar2);
  auVar3 = vfnmadd213sd_avx512f(auVar7,auVar20,auVar6);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4]) * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[8] *
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  auVar2 = vfmadd213sd_fma(auVar44,auVar20,auVar2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar15;
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar16,auVar41);
  auVar2 = vfmadd231sd_fma(auVar2,auVar37,auVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar16,auVar6);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       dVar31 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[10];
  auVar2 = vfnmadd213sd_fma(auVar38,auVar20,auVar2);
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar8,auVar20);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       dVar15 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
  auVar2 = vfnmadd213sd_fma(auVar42,auVar26,auVar2);
  auVar6 = vfmadd231sd_avx512f(auVar3,auVar8,auVar26);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd] * (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] +
               local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0]) *
               local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9];
  auVar2 = vfmadd213sd_fma(auVar33,auVar36,auVar2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[0];
  auVar2 = vfnmadd213sd_fma(auVar7,auVar20,auVar2);
  auVar7 = vmulsd_avx512f(auVar5,auVar4);
  auVar2 = vfmadd231sd_avx512f(auVar2,auVar8,auVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[10] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[5] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar2 = vfmadd213sd_fma(auVar3,auVar20,auVar2);
  auVar8 = vmulsd_avx512f(auVar5,auVar5);
  auVar9 = vmulsd_avx512f(auVar5,auVar8);
  auVar3 = vfmadd213sd_fma(ZEXT816(0xbfd8000000000000),auVar8,auVar4);
  auVar10 = vmulsd_avx512f(auVar5,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar8._0_8_ * auVar4._0_8_ * 0.0625;
  auVar4 = vfmadd231sd_fma(auVar11,auVar10,ZEXT816(0xbf88000000000000));
  dVar34 = auVar3._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar9._0_8_ * 0.125 + auVar7._0_8_ * -0.5;
  auVar3 = vaddsd_avx512f(auVar8,auVar6);
  auVar5 = vmulsd_avx512f(auVar5,auVar6);
  dVar31 = auVar3._0_8_;
  dVar15 = auVar2._0_8_ + auVar4._0_8_ + auVar5._0_8_ * -0.25;
  dVar1 = (dVar34 * dVar34) / -12.0 - dVar15;
  dVar13 = pow(dVar1,3.0);
  auVar2._0_8_ = dVar13 / -27.0;
  auVar18._0_8_ = pow(auVar2._0_8_,0.3333333333333333);
  auVar18._8_56_ = extraout_var;
  if (auVar18._0_8_ < 0.0) {
    dVar13 = sqrt(auVar18._0_8_);
  }
  else {
    auVar3 = vsqrtsd_avx(auVar18._0_16_,auVar18._0_16_);
    dVar13 = auVar3._0_8_;
  }
  auVar2._8_8_ = 0;
  if (auVar2._0_8_ < 0.0) {
    dVar14 = sqrt(auVar2._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar14 = auVar2._0_8_;
  }
  dVar15 = acos(((((dVar34 * dVar15) / 3.0 + (dVar34 * dVar34 * dVar34) / -108.0) -
                 dVar31 * dVar31 * 0.125) * -0.5) / dVar14);
  dVar15 = cos(dVar15 * 0.3333333333333333);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar15 * dVar13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1 * 0.3333333333333333;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar18._0_8_ * dVar15 * dVar13;
  auVar2 = vfmsub231sd_fma(auVar22,auVar4,auVar5);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar34;
  auVar23._0_8_ = auVar2._0_8_ / auVar18._0_8_;
  auVar23._8_8_ = auVar2._8_8_;
  auVar3 = vfmsub231sd_fma(auVar23,auVar21,ZEXT816(0xbfeaaaaaaaaaaaab));
  auVar2 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar3,auVar21);
  if (auVar2._0_8_ < 0.0) {
    auVar19._0_8_ = sqrt(auVar2._0_8_);
    auVar19._8_56_ = extraout_var_00;
    auVar2 = auVar19._0_16_;
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
  }
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar34;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar3._0_8_ * -2.0;
  auVar3 = vfmadd231sd_fma(auVar30,auVar24,ZEXT816(0xc008000000000000));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_108 * -0.25;
  auVar4 = vfmadd231sd_fma(auVar25,auVar2,ZEXT816(0xbfe0000000000000));
  dVar15 = (dVar31 + dVar31) / auVar2._0_8_ + auVar3._0_8_;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar15;
    auVar2 = vsqrtsd_avx(auVar17,auVar17);
    dVar15 = auVar2._0_8_;
  }
  (roots->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
       auVar4._0_8_ + dVar15 * 0.5;
  (roots->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       auVar4._0_8_ - dVar15 * 0.5;
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge::getEV(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Vector4d & roots )
{
  Eigen::Matrix4d G = composeG(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  // now compute the roots in closed-form
  //double G00_2 = G(0,0) * G(0,0);
  double G01_2 = G(0,1) * G(0,1);
  double G02_2 = G(0,2) * G(0,2);
  double G03_2 = G(0,3) * G(0,3);
  //double G11_2 = G(1,1) * G(1,1);
  double G12_2 = G(1,2) * G(1,2);
  double G13_2 = G(1,3) * G(1,3);
  //double G22_2 = G(2,2) * G(2,2);
  double G23_2 = G(2,3) * G(2,3);
  //double G33_2 = G(3,3) * G(3,3);
  
  double B = -G(3,3)-G(2,2)-G(1,1)-G(0,0);
  double C = -G23_2+G(2,2)*G(3,3)-G13_2-G12_2+G(1,1)*G(3,3)+G(1,1)*G(2,2)-G03_2-G02_2-G01_2+G(0,0)*G(3,3)+G(0,0)*G(2,2)+G(0,0)*G(1,1);
  double D = G13_2*G(2,2)-2.0*G(1,2)*G(1,3)*G(2,3)+G12_2*G(3,3)+G(1,1)*G23_2-G(1,1)*G(2,2)*G(3,3)+G03_2*G(2,2)+G03_2*G(1,1)-2.0*G(0,2)*G(0,3)*G(2,3)+G02_2*G(3,3)+G02_2*G(1,1)-2.0*G(0,1)*G(0,3)*G(1,3)-2.0*G(0,1)*G(0,2)*G(1,2)+G01_2*G(3,3)+G01_2*G(2,2)+G(0,0)*G23_2-G(0,0)*G(2,2)*G(3,3)+G(0,0)*G13_2+G(0,0)*G12_2-G(0,0)*G(1,1)*G(3,3)-G(0,0)*G(1,1)*G(2,2);
  double E = G03_2*G12_2-G03_2*G(1,1)*G(2,2)-2.0*G(0,2)*G(0,3)*G(1,2)*G(1,3)+2.0*G(0,2)*G(0,3)*G(1,1)*G(2,3)+G02_2*G13_2-G02_2*G(1,1)*G(3,3)+2.0*G(0,1)*G(0,3)*G(1,3)*G(2,2)-2.0*G(0,1)*G(0,3)*G(1,2)*G(2,3)-2.0*G(0,1)*G(0,2)*G(1,3)*G(2,3)+2.0*G(0,1)*G(0,2)*G(1,2)*G(3,3)+G01_2*G23_2-G01_2*G(2,2)*G(3,3)-G(0,0)*G13_2*G(2,2)+2.0*G(0,0)*G(1,2)*G(1,3)*G(2,3)-G(0,0)*G12_2*G(3,3)-G(0,0)*G(1,1)*G23_2+G(0,0)*G(1,1)*G(2,2)*G(3,3);

  double B_pw2 = B*B;
  double B_pw3 = B_pw2*B;
  double B_pw4 = B_pw3*B;
  double alpha = -0.375*B_pw2+C;
  double beta = B_pw3/8.0-B*C/2.0+D;
  double gamma = -0.01171875*B_pw4+B_pw2*C/16.0-B*D/4.0+E;
  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;
  double p = -alpha_pw2/12.0-gamma;
  double q = -alpha_pw3/108.0+alpha*gamma/3.0-pow(beta,2.0)/8.0;
  double helper1 = -pow(p,3.0)/27.0;
  double theta2 = pow( helper1, (1.0/3.0) );
  double theta1 = sqrt(theta2) * cos( (1.0/3.0) * acos( (-q/2.0) / sqrt(helper1) ) );
  double y = -(5.0/6.0)*alpha - ( (1.0/3.0) * p * theta1 - theta1 * theta2) / theta2;
  double w = sqrt(alpha+2.0*y);
  
  //we currently disable the computation of all other roots, they are not used
  //roots[0] = -B/4.0 + 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  //roots[1] = -B/4.0 + 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  double temp1 = -B/4.0 - 0.5*w;
  double temp2 = 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[2] = -B/4.0 - 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[3] = -B/4.0 - 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w); //this is the smallest one!
  roots[2] = temp1 + temp2;
  roots[3] = temp1 - temp2;
}